

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

void __thiscall wasm::WasmBinaryWriter::writeSourceMapProlog(WasmBinaryWriter *this)

{
  pointer pCVar1;
  ostream *this_00;
  int iVar2;
  pointer pcVar3;
  ostream *poVar4;
  size_t in_RCX;
  void *__buf;
  long lVar5;
  Module *pMVar6;
  char *pcVar7;
  ulong uVar8;
  pointer pCVar9;
  pointer local_60;
  ulong *local_58;
  code *local_50;
  code *local_48;
  ulong local_40;
  size_t pos;
  U32LEB ret;
  
  std::__ostream_insert<char,std::char_traits<char>>(this->sourceMap,"{\"version\":3,",0xd);
  pCVar9 = (this->wasm->customSections).
           super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar1 = (this->wasm->customSections).
           super__Vector_base<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>._M_impl.
           super__Vector_impl_data._M_finish;
  while( true ) {
    if (pCVar9 == pCVar1) goto LAB_00c5f9ea;
    iVar2 = std::__cxx11::string::compare((char *)pCVar9);
    if (iVar2 == 0) break;
    pCVar9 = pCVar9 + 1;
  }
  local_58 = &local_40;
  local_40 = 0;
  local_48 = std::
             _Function_handler<unsigned_char_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp:1211:16)>
             ::_M_invoke;
  local_50 = std::
             _Function_handler<unsigned_char_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-binary.cpp:1211:16)>
             ::_M_manager;
  local_60 = pCVar9;
  LEB<unsigned_int,_unsigned_char>::read
            ((LEB<unsigned_int,_unsigned_char> *)((long)&pos + 4),(int)&local_60,__buf,in_RCX);
  if (local_50 != (code *)0x0) {
    (*local_50)(&local_60,&local_60,3);
  }
  if ((long)(pCVar9->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(pCVar9->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start == pos._4_4_ + local_40) {
    std::__ostream_insert<char,std::char_traits<char>>(this->sourceMap,"\"debugId\":\"",0xb);
    for (uVar8 = local_40;
        pcVar3 = (pCVar9->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,
        uVar8 < (ulong)((long)(pCVar9->data).super__Vector_base<char,_std::allocator<char>_>._M_impl
                              .super__Vector_impl_data._M_finish - (long)pcVar3); uVar8 = uVar8 + 1)
    {
      this_00 = this->sourceMap;
      lVar5 = *(long *)this_00;
      poVar4 = this_00 + *(long *)(lVar5 + -0x18);
      if (this_00[*(long *)(lVar5 + -0x18) + 0xe1] == (ostream)0x0) {
        std::ios::widen((char)poVar4);
        poVar4[0xe1] = (ostream)0x1;
        lVar5 = *(long *)this_00;
        pcVar3 = (pCVar9->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      poVar4[0xe0] = (ostream)0x30;
      *(undefined8 *)(this_00 + *(long *)(lVar5 + -0x18) + 0x10) = 2;
      *(uint *)(this_00 + *(long *)(lVar5 + -0x18) + 0x18) =
           *(uint *)(this_00 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
      std::ostream::operator<<(this_00,(uint)(byte)pcVar3[uVar8]);
    }
    poVar4 = this->sourceMap;
    pcVar7 = "\",";
    lVar5 = 2;
  }
  else {
    poVar4 = (ostream *)&std::cerr;
    pcVar7 = "warning: build id section with an incorrect size detected!\n";
    lVar5 = 0x3b;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,lVar5);
LAB_00c5f9ea:
  pMVar6 = this->wasm;
  if ((pMVar6->debugInfoFile)._M_string_length != 0) {
    poVar4 = this->sourceMap;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"file",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\":\"",3);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(pMVar6->debugInfoFile)._M_dataplus._M_p,
                        (pMVar6->debugInfoFile)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\",",2);
    pMVar6 = this->wasm;
  }
  if ((pMVar6->debugInfoSourceRoot)._M_string_length != 0) {
    poVar4 = this->sourceMap;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"sourceRoot",10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\":\"",3);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(pMVar6->debugInfoSourceRoot)._M_dataplus._M_p,
                        (pMVar6->debugInfoSourceRoot)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\",",2);
    pMVar6 = this->wasm;
  }
  writeSourceMapProlog::anon_class_8_1_8991fb9c::operator()
            ((anon_class_8_1_8991fb9c *)this,"sources",&pMVar6->debugInfoFileNames);
  pMVar6 = this->wasm;
  if ((pMVar6->debugInfoSourcesContent).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pMVar6->debugInfoSourcesContent).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    writeSourceMapProlog::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)this,"sourcesContent",&pMVar6->debugInfoSourcesContent);
    pMVar6 = this->wasm;
  }
  writeSourceMapProlog::anon_class_8_1_8991fb9c::operator()
            ((anon_class_8_1_8991fb9c *)this,"names",&pMVar6->debugInfoSymbolNames);
  std::__ostream_insert<char,std::char_traits<char>>(this->sourceMap,"\"mappings\":\"",0xc);
  return;
}

Assistant:

void WasmBinaryWriter::writeSourceMapProlog() {
  *sourceMap << "{\"version\":3,";

  for (const auto& section : wasm->customSections) {
    if (section.name == BinaryConsts::CustomSections::BuildId) {
      U32LEB ret;
      size_t pos = 0;
      ret.read([&]() { return section.data[pos++]; });

      if (section.data.size() != pos + ret.value) {
        std::cerr
          << "warning: build id section with an incorrect size detected!\n";
        break;
      }

      *sourceMap << "\"debugId\":\"";
      for (size_t i = pos; i < section.data.size(); i++) {
        *sourceMap << std::setfill('0') << std::setw(2) << std::hex
                   << static_cast<int>(static_cast<uint8_t>(section.data[i]));
      }
      *sourceMap << "\",";
      break;
    }
  }

  auto writeOptionalString = [&](const char* name, const std::string& str) {
    if (!str.empty()) {
      *sourceMap << "\"" << name << "\":\"" << str << "\",";
    }
  };

  writeOptionalString("file", wasm->debugInfoFile);
  writeOptionalString("sourceRoot", wasm->debugInfoSourceRoot);

  auto writeStringVector = [&](const char* name,
                               const std::vector<std::string>& vec) {
    *sourceMap << "\"" << name << "\":[";
    for (size_t i = 0; i < vec.size(); i++) {
      if (i > 0) {
        *sourceMap << ",";
      }
      *sourceMap << "\"" << vec[i] << "\"";
    }
    *sourceMap << "],";
  };

  writeStringVector("sources", wasm->debugInfoFileNames);

  if (!wasm->debugInfoSourcesContent.empty()) {
    writeStringVector("sourcesContent", wasm->debugInfoSourcesContent);
  }

  // TODO: This field is optional; maybe we should omit if it's empty.
  // TODO: Binaryen actually does not correctly preserve symbol names when it
  // rewrites the mappings. We should maybe just drop them, or else handle
  // them correctly.
  writeStringVector("names", wasm->debugInfoSymbolNames);

  *sourceMap << "\"mappings\":\"";
}